

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O3

SW_FT_Error SW_FT_Stroker_EndSubPath(SW_FT_Stroker stroker)

{
  SW_FT_Pos SVar1;
  SW_FT_Vector *pSVar2;
  SW_FT_Angle SVar3;
  SW_FT_Vector *pSVar4;
  SW_FT_Int in_EDX;
  SW_FT_Int extraout_EDX;
  SW_FT_Int side;
  SW_FT_Vector *pSVar5;
  SW_FT_UInt new_points;
  SW_FT_Bool reverse;
  ulong uVar6;
  byte *pbVar7;
  SW_FT_UInt SVar8;
  SW_FT_StrokeBorder border;
  uint uVar9;
  SW_FT_StrokeBorder right;
  
  if (stroker->subpath_open == '\0') {
    if (((stroker->center).x != (stroker->subpath_start).x) ||
       ((stroker->center).y != (stroker->subpath_start).y)) {
      SW_FT_Stroker_LineTo(stroker,&stroker->subpath_start);
    }
    stroker->angle_out = stroker->subpath_angle;
    SVar3 = SW_FT_Angle_Diff(stroker->angle_in,stroker->subpath_angle);
    if (SVar3 != 0) {
      uVar9 = (uint)((ulong)SVar3 >> 0x3f);
      ft_stroker_inside(stroker,uVar9,stroker->subpath_line_length);
      ft_stroker_outside(stroker,uVar9 ^ 1,stroker->subpath_line_length);
    }
    ft_stroke_border_close(stroker->borders,'\0');
    border = stroker->borders + 1;
    reverse = '\x01';
  }
  else {
    border = stroker->borders;
    ft_stroker_cap(stroker,stroker->angle_in,in_EDX);
    new_points = stroker->borders[1].num_points - stroker->borders[1].start;
    side = extraout_EDX;
    if (0 < (int)new_points) {
      ft_stroke_border_grow(border,new_points);
      uVar9 = stroker->borders[0].num_points;
      uVar6 = (ulong)stroker->borders[1].num_points;
      pSVar5 = stroker->borders[1].points;
      pSVar4 = pSVar5 + (uVar6 - 1);
      SVar8 = stroker->borders[1].start;
      if (pSVar5 + (int)SVar8 <= pSVar4) {
        pSVar5 = (SW_FT_Vector *)(stroker->borders[0].tags + uVar9);
        pSVar2 = stroker->borders[0].points + uVar9;
        pbVar7 = stroker->borders[1].tags + uVar6;
        do {
          pbVar7 = pbVar7 + -1;
          SVar1 = pSVar4->y;
          pSVar2->x = pSVar4->x;
          pSVar2->y = SVar1;
          *(byte *)&pSVar5->x = *pbVar7 & 0xf3;
          pSVar2 = pSVar2 + 1;
          pSVar5 = (SW_FT_Vector *)((long)&pSVar5->x + 1);
          pSVar4 = pSVar4 + -1;
          SVar8 = stroker->borders[1].start;
        } while (stroker->borders[1].points + (int)SVar8 <= pSVar4);
        uVar9 = border->num_points;
      }
      side = (SW_FT_Int)pSVar5;
      stroker->borders[1].num_points = SVar8;
      stroker->borders[0].num_points = uVar9 + new_points;
      stroker->borders[0].movable = '\0';
      stroker->borders[1].movable = '\0';
    }
    SVar1 = (stroker->subpath_start).y;
    (stroker->center).x = (stroker->subpath_start).x;
    (stroker->center).y = SVar1;
    ft_stroker_cap(stroker,stroker->subpath_angle + 0xb40000,side);
    reverse = '\0';
  }
  ft_stroke_border_close(border,reverse);
  return 0;
}

Assistant:

SW_FT_Error SW_FT_Stroker_EndSubPath(SW_FT_Stroker stroker)
{
    SW_FT_Error error = 0;

    if (stroker->subpath_open) {
        SW_FT_StrokeBorder right = stroker->borders;

        /* All right, this is an opened path, we need to add a cap between */
        /* right & left, add the reverse of left, then add a final cap     */
        /* between left & right.                                           */
        error = ft_stroker_cap(stroker, stroker->angle_in, 0);
        if (error) goto Exit;

        /* add reversed points from `left' to `right' */
        error = ft_stroker_add_reverse_left(stroker, TRUE);
        if (error) goto Exit;

        /* now add the final cap */
        stroker->center = stroker->subpath_start;
        error =
            ft_stroker_cap(stroker, stroker->subpath_angle + SW_FT_ANGLE_PI, 0);
        if (error) goto Exit;

        /* Now end the right subpath accordingly.  The left one is */
        /* rewind and doesn't need further processing.             */
        ft_stroke_border_close(right, FALSE);
    } else {
        SW_FT_Angle turn;
        SW_FT_Int   inside_side;

        /* close the path if needed */
        if (stroker->center.x != stroker->subpath_start.x ||
            stroker->center.y != stroker->subpath_start.y) {
            error = SW_FT_Stroker_LineTo(stroker, &stroker->subpath_start);
            if (error) goto Exit;
        }

        /* process the corner */
        stroker->angle_out = stroker->subpath_angle;
        turn = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);

        /* no specific corner processing is required if the turn is 0 */
        if (turn != 0) {
            /* when we turn to the right, the inside side is 0 */
            inside_side = 0;

            /* otherwise, the inside side is 1 */
            if (turn < 0) inside_side = 1;

            error = ft_stroker_inside(stroker, inside_side,
                                      stroker->subpath_line_length);
            if (error) goto Exit;

            /* process the outside side */
            error = ft_stroker_outside(stroker, 1 - inside_side,
                                       stroker->subpath_line_length);
            if (error) goto Exit;
        }

        /* then end our two subpaths */
        ft_stroke_border_close(stroker->borders + 0, FALSE);
        ft_stroke_border_close(stroker->borders + 1, TRUE);
    }

Exit:
    return error;
}